

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zmq.hpp
# Opt level: O3

void __thiscall zmq::socket_t::socket_t(socket_t *this,context_t *context_,int type_)

{
  void *pvVar1;
  error_t *this_00;
  
  pvVar1 = (void *)zmq_socket(context_->ptr,type_);
  (this->super_socket_base)._handle = pvVar1;
  this->ctxptr = context_->ptr;
  if (pvVar1 != (void *)0x0) {
    return;
  }
  this_00 = (error_t *)__cxa_allocate_exception(0x10);
  error_t::error_t(this_00);
  __cxa_throw(this_00,&error_t::typeinfo,std::exception::~exception);
}

Assistant:

socket_t(context_t &context_, int type_)
        : detail::socket_base(zmq_socket(static_cast<void*>(context_), type_))
        , ctxptr(static_cast<void*>(context_))
    {
        if (_handle == ZMQ_NULLPTR)
            throw error_t();
    }